

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_GetStringViewWithExtensions_Test::
~GeneratedMessageReflectionTest_GetStringViewWithExtensions_Test
          (GeneratedMessageReflectionTest_GetStringViewWithExtensions_Test *this)

{
  GeneratedMessageReflectionTest_GetStringViewWithExtensions_Test *this_local;
  
  ~GeneratedMessageReflectionTest_GetStringViewWithExtensions_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetStringViewWithExtensions) {
  unittest::TestAllExtensions message;
  google::protobuf::FileDescriptor const* descriptor_file =
      message.GetDescriptor()->file();
  google::protobuf::FieldDescriptor const* string_ext =
      descriptor_file->FindExtensionByName("optional_string_extension");
  google::protobuf::FieldDescriptor const* string_piece_ext =
      descriptor_file->FindExtensionByName("optional_string_piece_extension");
  google::protobuf::FieldDescriptor const* cord_ext =
      descriptor_file->FindExtensionByName("optional_cord_extension");
  message.SetExtension(proto2_unittest::optional_string_extension, "foo");
  message.SetExtension(proto2_unittest::optional_string_piece_extension, "bar");
  message.SetExtension(proto2_unittest::optional_cord_extension, "baz");
  const Reflection* reflection = message.GetReflection();
  Reflection::ScratchSpace scratch;

  EXPECT_EQ("foo", reflection->GetStringView(message, string_ext, scratch));
  EXPECT_EQ("bar",
            reflection->GetStringView(message, string_piece_ext, scratch));
  EXPECT_EQ("baz", reflection->GetStringView(message, cord_ext, scratch));
}